

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

void domagicportal(trap *ttmp)

{
  boolean bVar1;
  undefined8 in_RAX;
  char *line;
  undefined6 uStack_18;
  d_level target_level;
  
  _uStack_18 = in_RAX;
  bVar1 = next_to_u();
  if (bVar1 == '\0') {
    line = "You shudder for a moment.";
LAB_00249277:
    pline(line);
    return;
  }
  bVar1 = on_level(&u.uz,&u.uz0);
  if (bVar1 != '\0') {
    pline("You activated a magic portal!");
    if ((u.uz.dnum == dungeon_topology.d_astral_level.dnum) && ((u.uhave._0_1_ & 1) == 0)) {
      line = "You feel dizzy for a moment, but nothing happens...";
      goto LAB_00249277;
    }
    _uStack_18 = CONCAT26(ttmp->dst,uStack_18);
    schedule_goto(&target_level,'\0','\0',1,"You feel dizzy for a moment, but the sensation passes."
                  ,(char *)0x0);
  }
  return;
}

Assistant:

void domagicportal(struct trap *ttmp)
{
	struct d_level target_level;

	if (!next_to_u()) {
		pline("You shudder for a moment.");
		return;
	}

	/* if landed from another portal, do nothing */
	/* problem: level teleport landing escapes the check */
	if (!on_level(&u.uz, &u.uz0)) return;

	pline("You activated a magic portal!");

	/* prevent the poor shnook, whose amulet was stolen while in
	 * the endgame, from accidently triggering the portal to the
	 * next level, and thus losing the game
	 */
	if (In_endgame(&u.uz) && !u.uhave.amulet) {
	    pline("You feel dizzy for a moment, but nothing happens...");
	    return;
	}

	target_level = ttmp->dst;
	schedule_goto(&target_level, FALSE, FALSE, 1,
		      "You feel dizzy for a moment, but the sensation passes.",
		      NULL);
}